

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O1

uint __thiscall llvm::SourceMgr::SrcBuffer::getLineNumber<unsigned_char>(SrcBuffer *this,char *Ptr)

{
  pointer *ppuVar1;
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> _Var2;
  char *pcVar3;
  char *pcVar4;
  iterator __position;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  undefined8 in_RAX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined8 uStack_38;
  
  uVar8 = (this->OffsetCache).Val.Val.Value;
  uStack_38 = in_RAX;
  if (uVar8 < 8) {
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)operator_new(0x18);
    (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (((ulong)this_00 & 7) != 0) {
      __assert_fail("(PtrWord & ~PointerBitMask) == 0 && \"Pointer is not sufficiently aligned\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/PointerIntPair.h"
                    ,0xa3,
                    "static intptr_t llvm::PointerIntPairInfo<void *, 1, llvm::PointerUnionUIntTraits<std::vector<unsigned char> *, std::vector<unsigned short> *>>::updatePointer(intptr_t, PointerT) [PointerT = void *, IntBits = 1, PtrTraits = llvm::PointerUnionUIntTraits<std::vector<unsigned char> *, std::vector<unsigned short> *>]"
                   );
    }
    (this->OffsetCache).Val.Val.Value = (intptr_t)this_00;
    _Var2._M_head_impl =
         (this->Buffer)._M_t.
         super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
         super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
         super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
    pcVar3 = (_Var2._M_head_impl)->BufferStart;
    pcVar4 = (_Var2._M_head_impl)->BufferEnd;
    uVar8 = (long)pcVar4 - (long)pcVar3;
    if (0xff < uVar8) {
      __assert_fail("Sz <= std::numeric_limits<T>::max()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                    ,0x51,
                    "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned char]"
                   );
    }
    if (pcVar4 != pcVar3) {
      lVar11 = 0;
      do {
        if (pcVar3[lVar11] == '\n') {
          uStack_38 = CONCAT17((uchar)lVar11,(undefined7)uStack_38);
          __position._M_current =
               (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>(this_00,__position,(uchar *)((long)&uStack_38 + 7));
          }
          else {
            *__position._M_current = (uchar)lVar11;
            ppuVar1 = &(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
        }
        lVar11 = lVar11 + 1;
      } while (uVar8 + (uVar8 == 0) != lVar11);
    }
  }
  else {
    if ((uVar8 & 6) != 0) {
      __assert_fail("is<T>() && \"Invalid accessor called\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/PointerUnion.h"
                    ,0x189,
                    "T llvm::PointerUnion4<std::vector<unsigned char> *, std::vector<unsigned short> *, std::vector<unsigned int> *, std::vector<unsigned long> *>::get() const [PT1 = std::vector<unsigned char> *, PT2 = std::vector<unsigned short> *, PT3 = std::vector<unsigned int> *, PT4 = std::vector<unsigned long> *, T = std::vector<unsigned char> *]"
                   );
    }
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(uVar8 & 0xfffffffffffffff8);
  }
  _Var2._M_head_impl =
       (this->Buffer)._M_t.
       super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
       super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
       super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
  pcVar3 = (_Var2._M_head_impl)->BufferStart;
  if ((pcVar3 <= Ptr) && (Ptr <= (_Var2._M_head_impl)->BufferEnd)) {
    uVar8 = (long)Ptr - (long)pcVar3;
    if (uVar8 < 0x100) {
      pbVar5 = (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pbVar7 = pbVar5;
      uVar10 = (long)(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pbVar5;
      while (pbVar6 = pbVar7, 0 < (long)uVar10) {
        uVar9 = uVar10 >> 1;
        uVar10 = ~uVar9 + uVar10;
        pbVar7 = pbVar6 + uVar9 + 1;
        if ((byte)uVar8 <= pbVar6[uVar9]) {
          pbVar7 = pbVar6;
          uVar10 = uVar9;
        }
      }
      return ((int)pbVar6 - (int)pbVar5) + 1;
    }
    __assert_fail("PtrDiff >= 0 && static_cast<size_t>(PtrDiff) <= std::numeric_limits<T>::max()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                  ,0x5f,
                  "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned char]"
                 );
  }
  __assert_fail("Ptr >= BufStart && Ptr <= Buffer->getBufferEnd()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                ,0x5d,
                "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned char]"
               );
}

Assistant:

unsigned SourceMgr::SrcBuffer::getLineNumber(const char *Ptr) const {

  // Ensure OffsetCache is allocated and populated with offsets of all the
  // '\n' bytes.
  std::vector<T> *Offsets = nullptr;
  if (OffsetCache.isNull()) {
    Offsets = new std::vector<T>();
    OffsetCache = Offsets;
    size_t Sz = Buffer->getBufferSize();
    assert(Sz <= std::numeric_limits<T>::max());
    StringRef S = Buffer->getBuffer();
    for (size_t N = 0; N < Sz; ++N) {
      if (S[N] == '\n') {
        Offsets->push_back(static_cast<T>(N));
      }
    }
  } else {
    Offsets = OffsetCache.get<std::vector<T> *>();
  }

  const char *BufStart = Buffer->getBufferStart();
  assert(Ptr >= BufStart && Ptr <= Buffer->getBufferEnd());
  ptrdiff_t PtrDiff = Ptr - BufStart;
  assert(PtrDiff >= 0 && static_cast<size_t>(PtrDiff) <= std::numeric_limits<T>::max());
  T PtrOffset = static_cast<T>(PtrDiff);

  // std::lower_bound returns the first EOL offset that's not-less-than
  // PtrOffset, meaning the EOL that _ends the line_ that PtrOffset is on
  // (including if PtrOffset refers to the EOL itself). If there's no such
  // EOL, returns end().
  auto EOL = std::lower_bound(Offsets->begin(), Offsets->end(), PtrOffset);

  // Lines count from 1, so add 1 to the distance from the 0th line.
  return (1 + (EOL - Offsets->begin()));
}